

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void __thiscall IniProcessing::IniProcessing(IniProcessing *this,char *iniFileName,int param_2)

{
  char *pcVar1;
  int __oflag;
  allocator local_51;
  string local_50 [33];
  undefined1 local_2f;
  undefined1 local_2e;
  allocator local_2d [16];
  allocator local_1d;
  int local_1c;
  char *pcStack_18;
  int param_2_local;
  char *iniFileName_local;
  IniProcessing *this_local;
  
  local_1c = param_2;
  pcStack_18 = iniFileName;
  iniFileName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,iniFileName,&local_1d);
  local_2f = 1;
  (this->m_params).opened = false;
  (this->m_params).lineWithError = -1;
  (this->m_params).errorCode = ERR_OK;
  (this->m_params).modified = false;
  *(undefined8 *)&(this->m_params).iniData._M_h._M_rehash_policy = 0;
  (this->m_params).iniData._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_params).iniData._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_params).iniData._M_h._M_element_count = 0;
  (this->m_params).iniData._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_params).iniData._M_h._M_bucket_count = 0;
  (this->m_params).iniData._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::unordered_map(&(this->m_params).iniData);
  local_2e = 1;
  (this->m_params).currentGroup = (IniKeys *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->m_params).currentGroupName,"",local_2d);
  local_2e = 0;
  local_2f = 0;
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  pcVar1 = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  open(this,(char *)local_50,__oflag);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

IniProcessing::IniProcessing(const char *iniFileName, int) :
    m_params
    {
        iniFileName, false, -1, ERR_OK, false, params::IniSections(), nullptr, ""
#ifdef _WIN32
        , false
#endif
    }
{
    open(iniFileName);
}